

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsCreators.cpp
# Opt level: O2

bool chrono::utils::AddTriangleMeshGeometry
               (ChBody *body,shared_ptr<chrono::ChMaterialSurface> *material,string *obj_filename,
               string *name,ChVector<double> *pos,ChQuaternion<double> *rot,bool visualization,
               shared_ptr<chrono::ChVisualMaterial> vis_material)

{
  double *pdVar1;
  double dVar2;
  pointer pCVar3;
  double dVar4;
  element_type *this;
  element_type *peVar5;
  int i;
  ulong uVar6;
  long lVar7;
  shared_ptr<chrono::ChTriangleMeshShape> trimesh_shape;
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> trimesh;
  shared_ptr<chrono::ChVisualShape> local_168;
  undefined1 local_158 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_140;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_138;
  __shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2> local_128;
  __shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2> local_118;
  __shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2> local_108;
  ChVector<double> local_f8;
  ChQuaternion<double> local_d8;
  shared_ptr<chrono::ChVisualModel> model;
  _Alloc_hider local_a8;
  
  geometry::ChTriangleMeshConnected::CreateFromWavefrontFile
            ((ChTriangleMeshConnected *)&trimesh,obj_filename,false,false);
  peVar5 = trimesh.
           super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (trimesh.
      super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)0x0) {
    lVar7 = 0;
    for (uVar6 = 0;
        pCVar3 = ((trimesh.
                   super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->m_vertices).
                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar6 < (ulong)(((long)((trimesh.
                                 super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->m_vertices).
                               super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar3) / 0x18);
        uVar6 = uVar6 + 1) {
      ChQuaternion<double>::Rotate(rot,(ChVector<double> *)((long)pCVar3->m_data + lVar7));
      dVar2 = pos->m_data[2];
      dVar4 = pos->m_data[1];
      pCVar3 = ((trimesh.
                 super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->m_vertices).
               super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar1 = (double *)((long)pCVar3->m_data + lVar7);
      *pdVar1 = pos->m_data[0] +
                (double)model.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr;
      pdVar1[1] = dVar4 + (double)model.
                                  super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi;
      *(double *)((long)pCVar3->m_data + lVar7 + 0x10) = dVar2 + (double)local_a8._M_p;
      lVar7 = lVar7 + 0x18;
    }
    std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
               &local_f8,
               &(body->collision_model).
                super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>)
    ;
    dVar2 = local_f8.m_data[0];
    std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_138,
               &material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)
    ;
    std::__shared_ptr<chrono::geometry::ChTriangleMesh,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<chrono::geometry::ChTriangleMeshConnected,void>
              ((__shared_ptr<chrono::geometry::ChTriangleMesh,(__gnu_cxx::_Lock_policy)2> *)
               (local_158 + 0x10),
               &trimesh.
                super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
              );
    local_d8.m_data[2] = 0.0;
    local_d8.m_data[0] = 0.0;
    local_d8.m_data[1] = 0.0;
    ChMatrix33<double>::ChMatrix33((ChMatrix33<double> *)&model,1.0);
    (*(*(_func_int ***)dVar2)[0x10])
              (0,dVar2,&local_138,local_158 + 0x10,0,0,&local_d8,(ChMatrix33<double> *)&model);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_140);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_138._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f8.m_data + 1));
    if (visualization) {
      ChPhysicsItem::GetVisualModel((ChPhysicsItem *)&model);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&model.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      if (model.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        std::make_shared<chrono::ChVisualModel>();
        std::__shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_108,
                   &model.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>);
        ChPhysicsItem::AddVisualModel
                  (&body->super_ChPhysicsItem,(shared_ptr<chrono::ChVisualModel> *)&local_108);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_108._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&model.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      chrono_types::make_shared<chrono::ChTriangleMeshShape,_0>();
      this = trimesh_shape.
             super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr(&local_118,
                   &trimesh.
                    super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                  );
      ChTriangleMeshShape::SetMesh
                (this,(shared_ptr<chrono::geometry::ChTriangleMeshConnected> *)&local_118,true);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_118._M_refcount);
      std::__cxx11::string::_M_assign
                ((string *)
                 &(trimesh_shape.
                   super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->name);
      std::__shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_128,
                 (__shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2> *)
                 vis_material.
                 super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      ChVisualShape::AddMaterial
                (&(trimesh_shape.
                   super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->super_ChVisualShape,(shared_ptr<chrono::ChVisualMaterial> *)&local_128);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_128._M_refcount);
      ChPhysicsItem::GetVisualModel((ChPhysicsItem *)local_158);
      std::__shared_ptr<chrono::ChVisualShape,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<chrono::ChTriangleMeshShape,void>
                ((__shared_ptr<chrono::ChVisualShape,(__gnu_cxx::_Lock_policy)2> *)&local_168,
                 &trimesh_shape.
                  super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>);
      local_d8.m_data[0] = (double)&DAT_3ff0000000000000;
      local_f8.m_data[2] = 0.0;
      local_d8.m_data[3] = 0.0;
      local_f8.m_data[0] = 0.0;
      local_f8.m_data[1] = 0.0;
      local_d8.m_data[1] = 0.0;
      local_d8.m_data[2] = 0.0;
      ChFrame<double>::ChFrame((ChFrame<double> *)&model,&local_f8,&local_d8);
      ChVisualModel::AddShape((ChVisualModel *)local_158._0_8_,&local_168,(ChFrame<double> *)&model)
      ;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_168.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_158 + 8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&trimesh_shape.
                  super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&trimesh.
              super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return peVar5 != (element_type *)0x0;
}

Assistant:

bool AddTriangleMeshGeometry(ChBody* body,
                             std::shared_ptr<ChMaterialSurface> material,
                             const std::string& obj_filename,
                             const std::string& name,
                             const ChVector<>& pos,
                             const ChQuaternion<>& rot,
                             bool visualization,
                             std::shared_ptr<ChVisualMaterial> vis_material) {
    auto trimesh = geometry::ChTriangleMeshConnected::CreateFromWavefrontFile(obj_filename, false, false);
    if (!trimesh)
        return false;

    for (int i = 0; i < trimesh->m_vertices.size(); i++)
        trimesh->m_vertices[i] = pos + rot.Rotate(trimesh->m_vertices[i]);

    body->GetCollisionModel()->AddTriangleMesh(material, trimesh, false, false);

    if (visualization) {
        if (!body->GetVisualModel()) {
            auto model = chrono_types::make_shared<ChVisualModel>();
            body->AddVisualModel(model);
        }
        auto trimesh_shape = chrono_types::make_shared<ChTriangleMeshShape>();
        trimesh_shape->SetMesh(trimesh);
        trimesh_shape->SetName(name);
        trimesh_shape->AddMaterial(vis_material);
        body->GetVisualModel()->AddShape(trimesh_shape, ChFrame<>());
    }

    return true;
}